

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusestrref(ASMState *as,IRIns *ir,RegSet allow)

{
  Reg RVar1;
  ASMState *as_00;
  ushort *in_RSI;
  long in_RDI;
  Reg r_1;
  Reg r;
  IRIns *irr;
  RegSet in_stack_ffffffffffffffd8;
  Reg in_stack_ffffffffffffffdc;
  ASMState *in_stack_ffffffffffffffe0;
  
  *(undefined1 *)(in_RDI + 0xa5) = 0x80;
  *(undefined1 *)(in_RDI + 0xa4) = 0x80;
  *(undefined1 *)(in_RDI + 0xa6) = 0;
  *(undefined4 *)(in_RDI + 0xa0) = 0x10;
  if (*in_RSI < 0x8000) {
    *(int *)(in_RDI + 0xa0) =
         *(int *)(*(long *)(in_RDI + 0x90) + (ulong)*in_RSI * 8) + *(int *)(in_RDI + 0xa0);
  }
  else {
    in_stack_ffffffffffffffdc =
         ra_alloc1(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    *(char *)(in_RDI + 0xa4) = (char)in_stack_ffffffffffffffdc;
  }
  as_00 = (ASMState *)(*(long *)(in_RDI + 0x90) + (ulong)in_RSI[1] * 8);
  if (in_RSI[1] < 0x8000) {
    *(RegCost *)(in_RDI + 0xa0) = as_00->cost[0] + *(int *)(in_RDI + 0xa0);
  }
  else {
    RVar1 = ra_alloc1(as_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    if (*(char *)(in_RDI + 0xa4) == -0x80) {
      *(char *)(in_RDI + 0xa4) = (char)RVar1;
    }
    else {
      *(char *)(in_RDI + 0xa5) = (char)RVar1;
    }
  }
  return;
}

Assistant:

static void asm_fusestrref(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irr;
  lj_assertA(ir->o == IR_STRREF, "bad IR op %d", ir->o);
  as->mrm.base = as->mrm.idx = RID_NONE;
  as->mrm.scale = XM_SCALE1;
  as->mrm.ofs = sizeof(GCstr);
  if (!LJ_GC64 && irref_isk(ir->op1)) {
    as->mrm.ofs += IR(ir->op1)->i;
  } else {
    Reg r = ra_alloc1(as, ir->op1, allow);
    rset_clear(allow, r);
    as->mrm.base = (uint8_t)r;
  }
  irr = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += irr->i;
  } else {
    Reg r;
    /* Fuse a constant add into the offset, e.g. string.sub(s, i+10). */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && irr->o == IR_ADD && irref_isk(irr->op2)) {
      as->mrm.ofs += IR(irr->op2)->i;
      r = ra_alloc1(as, irr->op1, allow);
    } else {
      r = ra_alloc1(as, ir->op2, allow);
    }
    if (as->mrm.base == RID_NONE)
      as->mrm.base = (uint8_t)r;
    else
      as->mrm.idx = (uint8_t)r;
  }
}